

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
geemuboi::test::core::CpuTest::verify_ld_r8_r8
          (CpuTest *this,uint8_t instruction,Registers *expected_regs)

{
  bool bVar1;
  pointer pIVar2;
  char *message;
  AssertHelper local_58 [3];
  Message local_40;
  int local_38;
  uint local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  Registers *expected_regs_local;
  uint8_t instruction_local;
  CpuTest *this_local;
  
  (this->regs).f = 0xf0;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected_regs;
  execute_instruction(this,instruction);
  (gtest_ar.message_.ptr_)->field_0x7 = 0xf0;
  *(undefined2 *)&(gtest_ar.message_.ptr_)->_M_string_length = 1;
  verify_state_changes(this,(Registers *)gtest_ar.message_.ptr_);
  pIVar2 = std::unique_ptr<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>::
           operator->(&this->cpu);
  local_34 = (*pIVar2->_vptr_ICpu[1])();
  local_38 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_30,"cpu->get_cycles_executed()","1",&local_34,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x5d,message);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

void verify_ld_r8_r8(uint8_t instruction, ICpu::Registers& expected_regs) {
        regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;

        execute_instruction(instruction);

        expected_regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;
        expected_regs.pc = 1;
        verify_state_changes(expected_regs);

        EXPECT_EQ(cpu->get_cycles_executed(), 1);
    }